

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMNodeImpl::setTextContent(DOMNodeImpl *this,XMLCh *textContent)

{
  uint uVar1;
  int iVar2;
  DOMException *this_00;
  DOMDocument *pDVar3;
  DOMNode *pDVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auVar5 [16];
  
  pDVar4 = this->fContainingNode;
  uVar1 = (*pDVar4->_vptr_DOMNode[4])(pDVar4);
  if (uVar1 < 0xd) {
    if ((0x19cU >> (uVar1 & 0x1f) & 1) != 0) {
      if ((this->flags & 1) == 0) {
        (*pDVar4->_vptr_DOMNode[0x13])(pDVar4,textContent);
        return;
      }
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      pDVar3 = getOwnerDocument(this);
      if (pDVar3 == (DOMDocument *)0x0) {
        pDVar4 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
      }
      else {
        pDVar3 = getOwnerDocument(this);
        pDVar4 = &pDVar3[10].super_DOMNode;
      }
      DOMException::DOMException(this_00,7,0,(MemoryManager *)pDVar4->_vptr_DOMNode);
      goto LAB_00282402;
    }
    if ((0x862U >> (uVar1 & 0x1f) & 1) != 0) {
      if ((this->flags & 1) == 0) {
        while( true ) {
          iVar2 = (*pDVar4->_vptr_DOMNode[7])(pDVar4);
          if (CONCAT44(extraout_var,iVar2) == 0) break;
          (*pDVar4->_vptr_DOMNode[0x10])(pDVar4,CONCAT44(extraout_var,iVar2));
        }
        if (textContent == (XMLCh *)0x0) {
          return;
        }
        iVar2 = (*pDVar4->_vptr_DOMNode[0xc])(pDVar4);
        auVar5 = (**(code **)(*(long *)(CONCAT44(extraout_var_00,iVar2) + -8) + 0x1f0))
                           (CONCAT44(extraout_var_00,iVar2) + -8,textContent);
        (*pDVar4->_vptr_DOMNode[0x11])(pDVar4,auVar5._0_8_,auVar5._8_8_,pDVar4->_vptr_DOMNode[0x11])
        ;
        return;
      }
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      pDVar3 = getOwnerDocument(this);
      if (pDVar3 == (DOMDocument *)0x0) {
        pDVar4 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
      }
      else {
        pDVar3 = getOwnerDocument(this);
        pDVar4 = &pDVar3[10].super_DOMNode;
      }
      DOMException::DOMException(this_00,7,0,(MemoryManager *)pDVar4->_vptr_DOMNode);
      goto LAB_00282402;
    }
    if ((0x1600U >> (uVar1 & 0x1f) & 1) != 0) {
      return;
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  pDVar3 = getOwnerDocument(this);
  if (pDVar3 == (DOMDocument *)0x0) {
    pDVar4 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar3 = getOwnerDocument(this);
    pDVar4 = &pDVar3[10].super_DOMNode;
  }
  DOMException::DOMException(this_00,9,0,(MemoryManager *)pDVar4->_vptr_DOMNode);
LAB_00282402:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMNodeImpl::setTextContent(const XMLCh* textContent) {
    DOMNode *thisNode = getContainingNode();
    switch (thisNode->getNodeType())
    {
        case DOMNode::ELEMENT_NODE:
        case DOMNode::ENTITY_NODE:
        case DOMNode::ENTITY_REFERENCE_NODE:
        case DOMNode::DOCUMENT_FRAGMENT_NODE:
            {
                if (isReadOnly())
                  throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);

                // Remove all childs
                DOMNode* current = thisNode->getFirstChild();
                while (current != NULL)
                {
                    thisNode->removeChild(current);
                    current = thisNode->getFirstChild();
                }
                if (textContent != NULL)
                {
                    // Add textnode containing data
                    current = ((DOMDocumentImpl*)thisNode->getOwnerDocument())->createTextNode(textContent);
                    thisNode->appendChild(current);
                }
            }
            break;

        case DOMNode::ATTRIBUTE_NODE:
        case DOMNode::TEXT_NODE:
        case DOMNode::CDATA_SECTION_NODE:
        case DOMNode::COMMENT_NODE:
        case DOMNode::PROCESSING_INSTRUCTION_NODE:
            if (isReadOnly())
                throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);

            thisNode->setNodeValue(textContent);
            break;

        case DOMNode::DOCUMENT_NODE:
        case DOMNode::DOCUMENT_TYPE_NODE:
        case DOMNode::NOTATION_NODE:
            break;

        default:
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, GetDOMNodeMemoryManager);
    }
}